

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLowering.cpp
# Opt level: O0

void __thiscall
wasm::StringLowering::replaceInstructions(wasm::Module*)::Replacer::visitStringEncode(wasm::
StringEncode__(void *this,StringEncode *curr)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Module *wasm;
  Call *expression;
  Type local_98 [3];
  allocator<wasm::Expression_*> local_79;
  Expression *local_78;
  pointer local_70;
  pointer local_68;
  iterator local_60;
  size_type local_58;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_50;
  size_t local_38;
  char *pcStack_30;
  Builder local_20;
  Builder builder;
  StringEncode *curr_local;
  Replacer *this_local;
  
  builder.wasm = (Module *)curr;
  wasm = Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::getModule
                   ((Walker<Replacer,_wasm::Visitor<Replacer,_void>_> *)((long)this + 0x58));
  Builder::Builder(&local_20,wasm);
  if (*(int *)&((builder.wasm)->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == 1) {
    local_38 = *(size_t *)(*(long *)((long)this + 0x130) + 0x130);
    pcStack_30 = *(char **)(*(long *)((long)this + 0x130) + 0x138);
    local_78 = (Expression *)
               ((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_70 = ((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_68 = ((builder.wasm)->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_60 = &local_78;
    local_58 = 3;
    std::allocator<wasm::Expression_*>::allocator(&local_79);
    __l._M_len = local_58;
    __l._M_array = local_60;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_50,__l,&local_79);
    wasm::Type::Type(local_98,i32);
    target.super_IString.str._M_str = pcStack_30;
    target.super_IString.str._M_len = local_38;
    expression = Builder::makeCall(&local_20,target,&local_50,local_98[0],false);
    Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::replaceCurrent
              ((Walker<Replacer,_wasm::Visitor<Replacer,_void>_> *)((long)this + 0x58),
               (Expression *)expression);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_50);
    std::allocator<wasm::Expression_*>::~allocator(&local_79);
    return;
  }
  handle_unreachable("TODO: all of string.encode*",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/StringLowering.cpp"
                     ,0x1c6);
}

Assistant:

void visitStringEncode(StringEncode* curr) {
        Builder builder(*getModule());
        switch (curr->op) {
          case StringEncodeWTF16Array:
            replaceCurrent(
              builder.makeCall(lowering.intoCharCodeArrayImport,
                               {curr->str, curr->array, curr->start},
                               Type::i32));
            return;
          default:
            WASM_UNREACHABLE("TODO: all of string.encode*");
        }
      }